

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_pipeline(ConvolutionDepthWise_x86 *this,Option *opt)

{
  int iVar1;
  _func_int *p_Var2;
  int *piVar3;
  void *pvVar4;
  long *plVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer ppLVar11;
  Layer *pLVar12;
  long lVar13;
  _func_int **pp_Var14;
  int iVar15;
  int iVar16;
  pointer ppLVar17;
  long lVar18;
  Mat weight_data_g;
  ParamDict pd;
  ModelBinFromMatArray local_b48;
  undefined4 uStack_b38;
  undefined4 uStack_b34;
  undefined4 uStack_b30;
  long *local_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  long local_b10;
  int local_b00;
  int local_afc;
  _func_int **local_af8;
  undefined4 uStack_af0;
  undefined4 uStack_aec;
  undefined4 uStack_ae8;
  undefined4 uStack_ae4;
  undefined4 uStack_ae0;
  long *local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  long lStack_ac0;
  void *local_ab8;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  undefined4 local_aa8;
  undefined4 uStack_aa4;
  int local_aa0;
  Allocator *local_a98;
  int local_a90;
  int iStack_a8c;
  undefined8 uStack_a88;
  size_t local_a80;
  undefined8 *puStack_a78;
  undefined1 local_a70 [8];
  undefined1 auStack_a6c [8];
  undefined1 auStack_a64 [12];
  Mat local_a58;
  _func_int **local_a18;
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a08;
  undefined4 uStack_a04;
  undefined4 uStack_a00;
  long *local_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  long local_9e0;
  _func_int **local_9d8;
  int *piStack_9d0;
  undefined8 uStack_9c8;
  undefined4 uStack_9c0;
  long *local_9b8;
  undefined4 local_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined8 local_9a0;
  _func_int **local_998;
  undefined4 uStack_990;
  undefined4 uStack_98c;
  undefined4 uStack_988;
  undefined4 uStack_984;
  undefined4 uStack_980;
  long *local_978;
  undefined4 local_970;
  undefined4 uStack_96c;
  undefined4 uStack_968;
  undefined4 uStack_964;
  undefined8 local_960;
  long local_950;
  size_t local_948;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_940;
  undefined1 local_938 [32];
  long *local_918;
  Allocator *local_910 [284];
  
  auStack_a64._4_8_ = opt;
  switch(*(undefined4 *)(&this->field_0xc0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
  case 1:
    pLVar12 = create_layer(0x1a);
    this->activation = pLVar12;
    ParamDict::ParamDict((ParamDict *)local_938);
    (*this->activation->_vptr_Layer[2])(this->activation,(ParamDict *)local_938);
    lVar18 = 0x8c0;
    do {
      piVar3 = *(int **)(local_938 + lVar18 + 8);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (*(long **)((long)&local_918 + lVar18) == (long *)0x0) {
            if (*(void **)(local_938 + lVar18) != (void *)0x0) {
              free(*(void **)(local_938 + lVar18));
            }
          }
          else {
            (**(code **)(**(long **)((long)&local_918 + lVar18) + 0x18))();
          }
        }
      }
      *(undefined8 *)(local_938 + lVar18 + 0xc) = 0;
      *(undefined8 *)(local_938 + lVar18 + 0x14) = 0;
      *(undefined8 *)(local_938 + lVar18) = 0;
      *(undefined8 *)(local_938 + lVar18 + 8) = 0;
      *(undefined8 *)((long)local_910 + lVar18) = 0;
      *(undefined8 *)((long)local_910 + lVar18 + 8) = 0;
      *(undefined8 *)((long)local_910 + lVar18 + 0x10) = 0;
      lVar18 = lVar18 + -0x48;
    } while (lVar18 != -0x40);
    break;
  case 2:
    pLVar12 = create_layer(0x1a);
    this->activation = pLVar12;
    ParamDict::ParamDict((ParamDict *)local_938);
    ParamDict::set((ParamDict *)local_938,0,
                   **(float **)(&this->field_0xc8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]))
    ;
    (*this->activation->_vptr_Layer[2])(this->activation,local_938);
    lVar18 = 0x8c0;
    do {
      piVar3 = *(int **)(local_938 + lVar18 + 8);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (*(long **)((long)&local_918 + lVar18) == (long *)0x0) {
            if (*(void **)(local_938 + lVar18) != (void *)0x0) {
              free(*(void **)(local_938 + lVar18));
            }
          }
          else {
            (**(code **)(**(long **)((long)&local_918 + lVar18) + 0x18))();
          }
        }
      }
      *(undefined8 *)(local_938 + lVar18 + 0xc) = 0;
      *(undefined8 *)(local_938 + lVar18 + 0x14) = 0;
      *(undefined8 *)(local_938 + lVar18) = 0;
      *(undefined8 *)(local_938 + lVar18 + 8) = 0;
      *(undefined8 *)((long)local_910 + lVar18) = 0;
      *(undefined8 *)((long)local_910 + lVar18 + 8) = 0;
      *(undefined8 *)((long)local_910 + lVar18 + 0x10) = 0;
      lVar18 = lVar18 + -0x48;
    } while (lVar18 != -0x40);
    break;
  case 3:
    pLVar12 = create_layer(0x36);
    this->activation = pLVar12;
    ParamDict::ParamDict((ParamDict *)local_938);
    ParamDict::set((ParamDict *)local_938,0,
                   **(float **)(&this->field_0xc8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]))
    ;
    ParamDict::set((ParamDict *)local_938,1,
                   *(float *)(*(long *)(&this->field_0xc8 +
                                       (long)this->_vptr_ConvolutionDepthWise_x86[-3]) + 4));
    (*this->activation->_vptr_Layer[2])(this->activation,local_938);
    lVar18 = 0x8c0;
    do {
      piVar3 = *(int **)(local_938 + lVar18 + 8);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (*(long **)((long)&local_918 + lVar18) == (long *)0x0) {
            if (*(void **)(local_938 + lVar18) != (void *)0x0) {
              free(*(void **)(local_938 + lVar18));
            }
          }
          else {
            (**(code **)(**(long **)((long)&local_918 + lVar18) + 0x18))();
          }
        }
      }
      *(undefined8 *)(local_938 + lVar18 + 0xc) = 0;
      *(undefined8 *)(local_938 + lVar18 + 0x14) = 0;
      *(undefined8 *)(local_938 + lVar18) = 0;
      *(undefined8 *)(local_938 + lVar18 + 8) = 0;
      *(undefined8 *)((long)local_910 + lVar18) = 0;
      *(undefined8 *)((long)local_910 + lVar18 + 8) = 0;
      *(undefined8 *)((long)local_910 + lVar18 + 0x10) = 0;
      lVar18 = lVar18 + -0x48;
    } while (lVar18 != -0x40);
    break;
  case 4:
    pLVar12 = create_layer(0x1e);
    this->activation = pLVar12;
    ParamDict::ParamDict((ParamDict *)local_938);
    (*this->activation->_vptr_Layer[2])(this->activation,(ParamDict *)local_938);
    lVar18 = 0x8c0;
    do {
      piVar3 = *(int **)(local_938 + lVar18 + 8);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (*(long **)((long)&local_918 + lVar18) == (long *)0x0) {
            if (*(void **)(local_938 + lVar18) != (void *)0x0) {
              free(*(void **)(local_938 + lVar18));
            }
          }
          else {
            (**(code **)(**(long **)((long)&local_918 + lVar18) + 0x18))();
          }
        }
      }
      *(undefined8 *)(local_938 + lVar18 + 0xc) = 0;
      *(undefined8 *)(local_938 + lVar18 + 0x14) = 0;
      *(undefined8 *)(local_938 + lVar18) = 0;
      *(undefined8 *)(local_938 + lVar18 + 8) = 0;
      *(undefined8 *)((long)local_910 + lVar18) = 0;
      *(undefined8 *)((long)local_910 + lVar18 + 8) = 0;
      *(undefined8 *)((long)local_910 + lVar18 + 0x10) = 0;
      lVar18 = lVar18 + -0x48;
    } while (lVar18 != -0x40);
  }
  pLVar12 = this->activation;
  if (pLVar12 != (Layer *)0x0) {
    (*pLVar12->_vptr_Layer[4])(pLVar12,auStack_a64._4_8_);
  }
  ppLVar17 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar16 = *(int *)(&this->field_0x88 + (long)p_Var2) * *(int *)(&this->field_0x84 + (long)p_Var2);
  iVar1 = *(int *)(&this->field_0x80 + (long)p_Var2);
  iVar15 = *(int *)(&this->field_0xb8 + (long)p_Var2);
  uVar6 = (long)*(int *)(&this->field_0xb4 + (long)p_Var2) / (long)iVar15;
  uVar6 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / (long)iVar16;
  ppLVar11 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar11 - (long)ppLVar17) >> 3)) {
    lVar18 = 0;
    do {
      if (ppLVar17[lVar18] != (Layer *)0x0) {
        (*ppLVar17[lVar18]->_vptr_Layer[1])();
      }
      lVar18 = lVar18 + 1;
      ppLVar17 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar11 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar18 < (int)((ulong)((long)ppLVar11 - (long)ppLVar17) >> 3));
  }
  iVar15 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                (long)(iVar1 / iVar15)) * iVar15;
  if (ppLVar11 != ppLVar17) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar17;
  }
  p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar1 = *(int *)(&this->field_0xb8 + (long)p_Var2);
  if (((((iVar15 == iVar1) && (iVar1 == *(int *)(&this->field_0x80 + (long)p_Var2))) &&
       (*(int *)(&this->field_0x84 + (long)p_Var2) == 3)) &&
      ((*(int *)(&this->field_0x88 + (long)p_Var2) == 3 &&
       (*(int *)(&this->field_0x8c + (long)p_Var2) == 1)))) &&
     (*(int *)(&this->field_0x90 + (long)p_Var2) == 1)) {
    if (*(int *)(&this->field_0x94 + (long)p_Var2) == 2) {
      if (*(int *)(&this->field_0x98 + (long)p_Var2) == 2) {
        return 0;
      }
    }
    else if ((*(int *)(&this->field_0x94 + (long)p_Var2) == 1) &&
            (*(int *)(&this->field_0x98 + (long)p_Var2) == 1)) {
      return 0;
    }
  }
  local_940 = &this->group_ops;
  local_b00 = *(int *)(&this->field_0x80 + (long)p_Var2) / iVar1;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_940,(long)iVar1);
  pp_Var14 = this->_vptr_ConvolutionDepthWise_x86;
  if (0 < *(int *)(&this->field_0xb8 + (long)pp_Var14[-3])) {
    local_afc = (iVar15 / iVar1) * iVar16 * local_b00;
    local_948 = (size_t)local_afc;
    local_950 = (long)local_b00;
    unique0x00004880 = &local_9d8;
    local_a70 = (undefined1  [8])&local_9b0;
    lVar18 = 0;
    do {
      pp_Var14 = pp_Var14 + -3;
      p_Var2 = *pp_Var14;
      lVar13 = *(long *)(&this->field_0x118 + (long)p_Var2);
      local_ab8 = (void *)(lVar18 * local_948 * lVar13 +
                          *(long *)(&this->field_0x108 + (long)p_Var2));
      local_aa0 = *(int *)(&this->field_0x120 + (long)p_Var2);
      local_a98 = *(Allocator **)(&this->field_0x128 + (long)p_Var2);
      local_aa8 = (undefined4)lVar13;
      uStack_aa4 = (undefined4)((ulong)lVar13 >> 0x20);
      iStack_a8c = (int)local_948;
      local_a90 = 1;
      uStack_ae8 = 0;
      uStack_ae4 = 0;
      uStack_ae0 = 0;
      local_af8 = (_func_int **)0x0;
      local_ac8 = 0;
      lStack_ac0 = 0;
      local_ad8 = (long *)0x0;
      uStack_ad0 = 0;
      if (*(int *)(&this->field_0xb0 + (long)*pp_Var14) != 0) {
        p_Var2 = *pp_Var14;
        lVar13 = *(long *)(&this->field_0x158 + (long)p_Var2);
        local_af8 = (_func_int **)
                    (lVar18 * local_950 * lVar13 + *(long *)(&this->field_0x148 + (long)p_Var2));
        uStack_ae0 = *(undefined4 *)(&this->field_0x160 + (long)p_Var2);
        local_ad8 = *(long **)(&this->field_0x168 + (long)p_Var2);
        local_938._16_4_ = (undefined4)lVar13;
        local_938._20_4_ = (undefined4)((ulong)lVar13 >> 0x20);
        uStack_ad0 = CONCAT44(local_b00,1);
        lStack_ac0 = local_950;
        local_ac8 = 0x100000001;
        uStack_ae4 = local_938._20_4_;
        uStack_ae8 = local_938._16_4_;
        local_938._16_4_ = 0;
        local_938._20_4_ = 0;
        local_938._24_4_ = 0;
        local_938._0_4_ = 0;
        local_938._4_4_ = (anon_union_4_2_947300a4_for_anon_struct_72_3_b6d6cd30_1)0x0;
        local_938._8_4_ = 0;
        local_938._12_4_ = 0;
        local_910[0] = (Allocator *)0x0;
        local_910[1] = (Allocator *)0x0;
        local_910[2] = (Allocator *)0x0;
        local_918 = local_ad8;
      }
      local_a80 = local_948;
      uStack_a88._0_4_ = 1;
      uStack_a88._4_4_ = 1;
      uStack_aac = 0;
      uStack_ab0 = 0;
      uStack_aec = 0;
      uStack_af0 = 0;
      pLVar12 = create_layer(6);
      ParamDict::ParamDict((ParamDict *)local_938);
      ParamDict::set((ParamDict *)local_938,0,local_b00);
      ParamDict::set((ParamDict *)local_938,1,
                     *(int *)(&this->field_0x84 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set((ParamDict *)local_938,0xb,
                     *(int *)(&this->field_0x88 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set((ParamDict *)local_938,2,
                     *(int *)(&this->field_0x8c + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set((ParamDict *)local_938,0xc,
                     *(int *)(&this->field_0x90 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set((ParamDict *)local_938,3,
                     *(int *)(&this->field_0x94 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set((ParamDict *)local_938,0xd,
                     *(int *)(&this->field_0x98 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set((ParamDict *)local_938,4,0);
      ParamDict::set((ParamDict *)local_938,0xe,0);
      ParamDict::set((ParamDict *)local_938,5,
                     *(int *)(&this->field_0xb0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set((ParamDict *)local_938,6,local_afc);
      ParamDict::set((ParamDict *)local_938,8,
                     *(int *)(&this->field_0xbc + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      (*pLVar12->_vptr_Layer[2])(pLVar12,(ParamDict *)local_938);
      if (*(int *)(&this->field_0xb0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) == 0) {
        lVar13 = 0x20;
        do {
          *(undefined8 *)((undefined1 *)((long)register0x00000020 + -0xa6c) + lVar13) = 0;
          *(undefined8 *)(auStack_a64 + lVar13) = 0;
          *(undefined8 *)((long)&puStack_a78 + lVar13) = 0;
          *(undefined8 *)(&stack0xfffffffffffff590 + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.data + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.refcount + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.elemsize + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.elempack + lVar13) = 0;
          lVar13 = lVar13 + 0x40;
        } while (lVar13 != 0xe0);
        piVar3 = (int *)CONCAT44(uStack_aac,uStack_ab0);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (int *)CONCAT44(local_a58.refcount._4_4_,local_a58.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_a58.allocator == (Allocator *)0x0) {
              if (local_a58.data != (void *)0x0) {
                free(local_a58.data);
              }
            }
            else {
              (**(code **)(*(long *)local_a58.allocator + 0x18))();
            }
          }
        }
        local_a58.data = local_ab8;
        local_a58.refcount._0_4_ = uStack_ab0;
        local_a58.refcount._4_4_ = uStack_aac;
        local_a58.elemsize._0_4_ = local_aa8;
        local_a58.elemsize._4_4_ = uStack_aa4;
        local_a58.elempack = local_aa0;
        local_a58.allocator = local_a98;
        local_a58.dims = local_a90;
        local_a58.w = iStack_a8c;
        local_a58.h = (int)uStack_a88;
        local_a58.c = uStack_a88._4_4_;
        local_a58.cstep = local_a80;
        if (*(int *)(&this->field_0xbc + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) != 0) {
          p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
          lVar13 = *(long *)(&this->field_0x198 + (long)p_Var2);
          local_b48.super_ModelBin._vptr_ModelBin =
               (_func_int **)(lVar13 * lVar18 + *(long *)(&this->field_0x188 + (long)p_Var2));
          uStack_b30 = *(undefined4 *)(&this->field_0x1a0 + (long)p_Var2);
          local_b28 = *(long **)(&this->field_0x1a8 + (long)p_Var2);
          local_b48.weights._0_4_ = 0;
          local_b48.weights._4_4_ = 0;
          uStack_b38 = (undefined4)lVar13;
          uStack_b34 = (undefined4)((ulong)lVar13 >> 0x20);
          local_b20._0_4_ = 1;
          local_b20._4_4_ = 1;
          uStack_b18._0_4_ = 1;
          uStack_b18._4_4_ = 1;
          local_b10 = 1;
          piVar3 = (int *)CONCAT44(uStack_a0c,uStack_a10);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_9f8 == (long *)0x0) {
                if (local_a18 != (_func_int **)0x0) {
                  free(local_a18);
                }
              }
              else {
                (**(code **)(*local_9f8 + 0x18))();
              }
            }
          }
          piVar3 = (int *)CONCAT44(local_b48.weights._4_4_,local_b48.weights._0_4_);
          local_a18 = local_b48.super_ModelBin._vptr_ModelBin;
          uStack_a10 = local_b48.weights._0_4_;
          uStack_a0c = local_b48.weights._4_4_;
          uStack_a08 = uStack_b38;
          uStack_a04 = uStack_b34;
          uStack_a00 = uStack_b30;
          local_9f8 = local_b28;
          local_9f0 = CONCAT44(local_b20._4_4_,(undefined4)local_b20);
          uStack_9e8 = CONCAT44(uStack_b18._4_4_,(undefined4)uStack_b18);
          local_9e0 = local_b10;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_b28 == (long *)0x0) {
                if (local_b48.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                  free(local_b48.super_ModelBin._vptr_ModelBin);
                }
              }
              else {
                (**(code **)(*local_b28 + 0x18))();
              }
            }
          }
          p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
          lVar13 = *(long *)(&this->field_0x1d8 + (long)p_Var2);
          local_b48.super_ModelBin._vptr_ModelBin =
               (_func_int **)(lVar13 * lVar18 + *(long *)(&this->field_0x1c8 + (long)p_Var2));
          uStack_b30 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var2);
          local_b28 = *(long **)(&this->field_0x1e8 + (long)p_Var2);
          local_b48.weights._0_4_ = 0;
          local_b48.weights._4_4_ = 0;
          uStack_b38 = (undefined4)lVar13;
          uStack_b34 = (undefined4)((ulong)lVar13 >> 0x20);
          local_b20._0_4_ = 1;
          local_b20._4_4_ = 1;
          uStack_b18._0_4_ = 1;
          uStack_b18._4_4_ = 1;
          local_b10 = 1;
          if (piStack_9d0 != (int *)0x0) {
            LOCK();
            *piStack_9d0 = *piStack_9d0 + -1;
            UNLOCK();
            if (*piStack_9d0 == 0) {
              if (local_9b8 == (long *)0x0) {
                if (local_9d8 != (_func_int **)0x0) {
                  free(local_9d8);
                }
              }
              else {
                (**(code **)(*local_9b8 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)stack0xfffffffffffff598 + 0xc) = 0;
          *(undefined8 *)((long)stack0xfffffffffffff598 + 0x14) = 0;
          *stack0xfffffffffffff598 = (_func_int **)0x0;
          stack0xfffffffffffff598[1] = (_func_int **)0x0;
          *(undefined8 *)local_a70 = 0;
          *(undefined8 *)((long)local_a70 + 8) = 0;
          *(undefined8 *)((long)local_a70 + 0x10) = 0;
          piStack_9d0 = (int *)CONCAT44(local_b48.weights._4_4_,local_b48.weights._0_4_);
          local_9d8 = local_b48.super_ModelBin._vptr_ModelBin;
          uStack_9c8 = CONCAT44(uStack_b34,uStack_b38);
          uStack_9c0 = uStack_b30;
          local_9b8 = local_b28;
          local_9b0 = (undefined4)local_b20;
          uStack_9ac = local_b20._4_4_;
          uStack_9a8 = (undefined4)uStack_b18;
          uStack_9a4 = uStack_b18._4_4_;
          local_9a0 = local_b10;
          if (piStack_9d0 != (int *)0x0) {
            LOCK();
            *piStack_9d0 = *piStack_9d0 + -1;
            UNLOCK();
            if (*piStack_9d0 == 0) {
              if (local_b28 == (long *)0x0) {
                if (local_b48.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                  free(local_b48.super_ModelBin._vptr_ModelBin);
                }
              }
              else {
                (**(code **)(*local_b28 + 0x18))();
              }
            }
          }
          uStack_b38 = 0;
          uStack_b34 = 0;
          uStack_b30 = 0;
          local_b48.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
          local_b48.weights._0_4_ = 0;
          local_b48.weights._4_4_ = 0;
          local_b20 = 0;
          uStack_b18 = 0;
          local_b10 = 0;
        }
        ModelBinFromMatArray::ModelBinFromMatArray(&local_b48,&local_a58);
        (*pLVar12->_vptr_Layer[3])(pLVar12,&local_b48);
        ModelBin::~ModelBin(&local_b48.super_ModelBin);
        lVar13 = 0x80;
        do {
          piVar3 = *(int **)((long)&local_a58.refcount + lVar13);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = *(void **)((long)&local_a58.data + lVar13);
              plVar5 = *(long **)((long)&local_a58.allocator + lVar13);
              if (plVar5 == (long *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_a58.refcount + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_a58.elemsize + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_a58.data + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.refcount + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.dims + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.h + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.cstep + lVar13) = 0;
          lVar13 = lVar13 + -0x40;
        } while (lVar13 != -0x40);
      }
      else {
        lVar13 = 0;
        do {
          *(undefined8 *)((long)&local_a58.refcount + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_a58.elemsize + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_a58.data + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.refcount + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.allocator + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.dims + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.h + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.cstep + lVar13) = 0;
          lVar13 = lVar13 + 0x40;
        } while (lVar13 != 0x100);
        piVar3 = (int *)CONCAT44(uStack_aac,uStack_ab0);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (int *)CONCAT44(local_a58.refcount._4_4_,local_a58.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_a58.allocator == (Allocator *)0x0) {
              if (local_a58.data != (void *)0x0) {
                free(local_a58.data);
              }
            }
            else {
              (**(code **)(*(long *)local_a58.allocator + 0x18))();
            }
          }
        }
        local_a58.data = local_ab8;
        local_a58.refcount._0_4_ = uStack_ab0;
        local_a58.refcount._4_4_ = uStack_aac;
        local_a58.elemsize._0_4_ = local_aa8;
        local_a58.elemsize._4_4_ = uStack_aa4;
        local_a58.elempack = local_aa0;
        local_a58.allocator = local_a98;
        uVar7._0_4_ = local_a90;
        uVar7._4_4_ = iStack_a8c;
        local_a58.dims = local_a90;
        local_a58.w = iStack_a8c;
        uVar8._0_4_ = (int)uStack_a88;
        uVar8._4_4_ = uStack_a88._4_4_;
        local_a58.h = (int)uStack_a88;
        local_a58.c = uStack_a88._4_4_;
        local_a58.cstep = local_a80;
        piVar3 = (int *)CONCAT44(uStack_aec,uStack_af0);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (int *)CONCAT44(uStack_a0c,uStack_a10);
        uVar9 = uVar7;
        uVar10 = uVar8;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          uVar9 = local_a58._40_8_;
          uVar10 = local_a58._48_8_;
          if (*piVar3 == 0) {
            if (local_9f8 == (long *)0x0) {
              if (local_a18 != (_func_int **)0x0) {
                local_a58._40_8_ = uVar7;
                local_a58._48_8_ = uVar8;
                free(local_a18);
                uVar9 = local_a58._40_8_;
                uVar10 = local_a58._48_8_;
              }
            }
            else {
              local_a58._40_8_ = uVar7;
              local_a58._48_8_ = uVar8;
              (**(code **)(*local_9f8 + 0x18))();
              uVar9 = local_a58._40_8_;
              uVar10 = local_a58._48_8_;
            }
          }
        }
        local_a58._48_8_ = uVar10;
        local_a58._40_8_ = uVar9;
        local_a18 = local_af8;
        uStack_a10 = uStack_af0;
        uStack_a0c = uStack_aec;
        uStack_a08 = uStack_ae8;
        uStack_a04 = uStack_ae4;
        uStack_a00 = uStack_ae0;
        local_9f8 = local_ad8;
        local_9f0 = uStack_ad0;
        uStack_9e8 = local_ac8;
        local_9e0 = lStack_ac0;
        if (*(int *)(&this->field_0xbc + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) != 0) {
          p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
          lVar13 = *(long *)(&this->field_0x198 + (long)p_Var2);
          local_b48.super_ModelBin._vptr_ModelBin =
               (_func_int **)(lVar13 * lVar18 + *(long *)(&this->field_0x188 + (long)p_Var2));
          uStack_b30 = *(undefined4 *)(&this->field_0x1a0 + (long)p_Var2);
          local_b28 = *(long **)(&this->field_0x1a8 + (long)p_Var2);
          local_b48.weights._0_4_ = 0;
          local_b48.weights._4_4_ = 0;
          uStack_b38 = (undefined4)lVar13;
          uStack_b34 = (undefined4)((ulong)lVar13 >> 0x20);
          local_b20._0_4_ = 1;
          local_b20._4_4_ = 1;
          uStack_b18._0_4_ = 1;
          uStack_b18._4_4_ = 1;
          local_b10 = 1;
          if (piStack_9d0 != (int *)0x0) {
            LOCK();
            *piStack_9d0 = *piStack_9d0 + -1;
            UNLOCK();
            if (*piStack_9d0 == 0) {
              if (local_9b8 == (long *)0x0) {
                if (local_9d8 != (_func_int **)0x0) {
                  free(local_9d8);
                }
              }
              else {
                (**(code **)(*local_9b8 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)stack0xfffffffffffff598 + 0xc) = 0;
          *(undefined8 *)((long)stack0xfffffffffffff598 + 0x14) = 0;
          *stack0xfffffffffffff598 = (_func_int **)0x0;
          stack0xfffffffffffff598[1] = (_func_int **)0x0;
          *(undefined8 *)local_a70 = 0;
          *(undefined8 *)((long)local_a70 + 8) = 0;
          *(undefined8 *)((long)local_a70 + 0x10) = 0;
          piStack_9d0 = (int *)CONCAT44(local_b48.weights._4_4_,local_b48.weights._0_4_);
          local_9d8 = local_b48.super_ModelBin._vptr_ModelBin;
          uStack_9c8 = CONCAT44(uStack_b34,uStack_b38);
          uStack_9c0 = uStack_b30;
          local_9b8 = local_b28;
          local_9b0 = (undefined4)local_b20;
          uStack_9ac = local_b20._4_4_;
          uStack_9a8 = (undefined4)uStack_b18;
          uStack_9a4 = uStack_b18._4_4_;
          local_9a0 = local_b10;
          if (piStack_9d0 != (int *)0x0) {
            LOCK();
            *piStack_9d0 = *piStack_9d0 + -1;
            UNLOCK();
            if (*piStack_9d0 == 0) {
              if (local_b28 == (long *)0x0) {
                if (local_b48.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                  free(local_b48.super_ModelBin._vptr_ModelBin);
                }
              }
              else {
                (**(code **)(*local_b28 + 0x18))();
              }
            }
          }
          p_Var2 = this->_vptr_ConvolutionDepthWise_x86[-3];
          lVar13 = *(long *)(&this->field_0x1d8 + (long)p_Var2);
          local_b48.super_ModelBin._vptr_ModelBin =
               (_func_int **)(lVar13 * lVar18 + *(long *)(&this->field_0x1c8 + (long)p_Var2));
          uStack_b30 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var2);
          local_b28 = *(long **)(&this->field_0x1e8 + (long)p_Var2);
          local_b48.weights._0_4_ = 0;
          local_b48.weights._4_4_ = 0;
          uStack_b38 = (undefined4)lVar13;
          uStack_b34 = (undefined4)((ulong)lVar13 >> 0x20);
          local_b20._0_4_ = 1;
          local_b20._4_4_ = 1;
          uStack_b18._0_4_ = 1;
          uStack_b18._4_4_ = 1;
          local_b10 = 1;
          piVar3 = (int *)CONCAT44(uStack_98c,uStack_990);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_978 == (long *)0x0) {
                if (local_998 != (_func_int **)0x0) {
                  free(local_998);
                }
              }
              else {
                (**(code **)(*local_978 + 0x18))();
              }
            }
          }
          piVar3 = (int *)CONCAT44(local_b48.weights._4_4_,local_b48.weights._0_4_);
          local_998 = local_b48.super_ModelBin._vptr_ModelBin;
          uStack_990 = local_b48.weights._0_4_;
          uStack_98c = local_b48.weights._4_4_;
          uStack_988 = uStack_b38;
          uStack_984 = uStack_b34;
          uStack_980 = uStack_b30;
          local_978 = local_b28;
          _local_970 = CONCAT44(local_b20._4_4_,(undefined4)local_b20);
          _uStack_968 = CONCAT44(uStack_b18._4_4_,(undefined4)uStack_b18);
          local_960 = local_b10;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_b28 == (long *)0x0) {
                if (local_b48.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                  free(local_b48.super_ModelBin._vptr_ModelBin);
                }
              }
              else {
                (**(code **)(*local_b28 + 0x18))();
              }
            }
          }
          uStack_b38 = 0;
          uStack_b34 = 0;
          uStack_b30 = 0;
          local_b48.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
          local_b48.weights._0_4_ = 0;
          local_b48.weights._4_4_ = 0;
          local_b20 = 0;
          uStack_b18 = 0;
          local_b10 = 0;
        }
        ModelBinFromMatArray::ModelBinFromMatArray(&local_b48,&local_a58);
        (*pLVar12->_vptr_Layer[3])(pLVar12,&local_b48);
        ModelBin::~ModelBin(&local_b48.super_ModelBin);
        lVar13 = 0xc0;
        do {
          piVar3 = *(int **)((long)&local_a58.refcount + lVar13);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = *(void **)((long)&local_a58.data + lVar13);
              plVar5 = *(long **)((long)&local_a58.allocator + lVar13);
              if (plVar5 == (long *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_a58.refcount + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_a58.elemsize + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_a58.data + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.refcount + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.dims + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.h + lVar13) = 0;
          *(undefined8 *)((long)&local_a58.cstep + lVar13) = 0;
          lVar13 = lVar13 + -0x40;
        } while (lVar13 != -0x40);
      }
      (*pLVar12->_vptr_Layer[4])(pLVar12,auStack_a64._4_8_);
      (local_940->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar18] = pLVar12;
      lVar13 = 0x8c0;
      do {
        piVar3 = *(int **)(local_938 + lVar13 + 8);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (*(long **)((long)&local_918 + lVar13) == (long *)0x0) {
              if (*(void **)(local_938 + lVar13) != (void *)0x0) {
                free(*(void **)(local_938 + lVar13));
              }
            }
            else {
              (**(code **)(**(long **)((long)&local_918 + lVar13) + 0x18))();
            }
          }
        }
        *(undefined8 *)(local_938 + lVar13 + 0xc) = 0;
        *(undefined8 *)(local_938 + lVar13 + 0x14) = 0;
        *(undefined8 *)(local_938 + lVar13) = 0;
        *(undefined8 *)(local_938 + lVar13 + 8) = 0;
        *(undefined8 *)((long)local_910 + lVar13) = 0;
        *(undefined8 *)((long)local_910 + lVar13 + 8) = 0;
        *(undefined8 *)((long)local_910 + lVar13 + 0x10) = 0;
        lVar13 = lVar13 + -0x48;
      } while (lVar13 != -0x40);
      piVar3 = (int *)CONCAT44(uStack_aec,uStack_af0);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_ad8 == (long *)0x0) {
            if (local_af8 != (_func_int **)0x0) {
              free(local_af8);
            }
          }
          else {
            (**(code **)(*local_ad8 + 0x18))();
          }
        }
      }
      uStack_ae8 = 0;
      uStack_ae4 = 0;
      uStack_ae0 = 0;
      local_af8 = (_func_int **)0x0;
      uStack_af0 = 0;
      uStack_aec = 0;
      uStack_ad0 = 0;
      local_ac8 = 0;
      lStack_ac0 = 0;
      piVar3 = (int *)CONCAT44(uStack_aac,uStack_ab0);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_a98 == (Allocator *)0x0) {
            if (local_ab8 != (void *)0x0) {
              free(local_ab8);
            }
          }
          else {
            (**(code **)(*(long *)local_a98 + 0x18))();
          }
        }
      }
      lVar18 = lVar18 + 1;
      pp_Var14 = this->_vptr_ConvolutionDepthWise_x86;
    } while (lVar18 < *(int *)(&this->field_0xb8 + (long)pp_Var14[-3]));
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// min
        pd.set(1, activation_params[1]);// max
        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt);
    }

    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i=0; i<(int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();      

    if (channels == group && group == num_output)
    {
        // depth-wise specific
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
        {
            if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
            {
                return 0;
            }
        }
    }    

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);     

    for (int g=0; g<group; g++)
    {  
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g);// num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);// pad_w
        pd.set(14, 0);// pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g);// weight_data_size
        pd.set(8, int8_scale_term);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales.range(g, 1);
                weights[3] = bottom_blob_int8_scales.range(g, 1);     
            }

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[3];
            weights[0] = weight_data_g;

            if (int8_scale_term)
            {
                weights[1] = weight_data_int8_scales.range(g, 1);
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }      

    return 0;
}